

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  pointer *pppFVar1;
  pointer *ppvVar2;
  string *psVar3;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  pointer ppFVar4;
  cpp *this_00;
  FieldDescriptor *field;
  iterator __position;
  iterator __position_00;
  undefined1 auVar5 [8];
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  FileOptions_OptimizeMode FVar10;
  FieldGenerator *pFVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar12;
  LogMessage *pLVar13;
  pointer ppFVar14;
  long lVar15;
  long lVar16;
  uint32 uVar17;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar18;
  FieldDescriptor *field_00;
  ulong uVar19;
  pointer puVar20;
  uint uVar21;
  iterator __first;
  long *plVar22;
  char *format_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  int *in_R8;
  stringpiece_ssize_type in_R9;
  size_type *psVar23;
  ulong uVar24;
  int iVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex HVar26;
  StringPiece has_bits_var;
  LogMessage local_248 [56];
  LogMessage local_210 [56];
  undefined1 local_1d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __end3;
  Iterator __end4;
  undefined1 local_180 [8];
  ColdChunkSkipper cold_skipper;
  Iterator __begin4;
  undefined1 local_100 [8];
  string chunk_mask_str;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  undefined1 auStack_a8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Formatter format;
  int local_34 [2];
  int cached_has_word_index;
  
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
    cold_skipper.access_info_map_ = (AccessInfoMap *)&cold_skipper;
    cold_skipper.chunks_._0_4_ = 0;
    cold_skipper.has_bit_indices_ = (vector<int,_std::allocator<int>_> *)0x0;
    cold_skipper.variables_._M_t._M_impl._0_8_ = 0;
    cold_skipper.cold_threshold_ = (double)cold_skipper.access_info_map_;
    SetUnknkownFieldsVariable
              (this->descriptor_,&this->options_,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_180);
    Formatter::AddMap((Formatter *)
                      &chunks.
                       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_180);
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
              );
    this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_180;
    goto LAB_001e3ce1;
  }
  if (1 < this->num_required_fields_) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
              );
    google::protobuf::io::Printer::Indent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"size_t total_size = 0;\n");
    ppFVar14 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar14 != ppFVar4) {
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar18 = extraout_RDX;
      do {
        this_00 = (cpp *)*ppFVar14;
        if (*(int *)(this_00 + 0x3c) == 2) {
          FieldName_abi_cxx11_((string *)local_180,this_00,pFVar18);
          Formatter::operator()
                    ((Formatter *)ppvVar2,"\nif (_internal_has_$1$()) {\n",(string *)local_180);
          if (local_180 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
            operator_delete((void *)local_180);
          }
          google::protobuf::io::Printer::Indent();
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)ppvVar2,(FieldDescriptor *)this_00);
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar11->_vptr_FieldGenerator[0x14])(pFVar11,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
          pFVar18 = extraout_RDX_00;
        }
        ppFVar14 = ppFVar14 + 1;
      } while (ppFVar14 != ppFVar4);
    }
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"\nreturn total_size;\n");
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
            );
  google::protobuf::io::Printer::Indent();
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"size_t total_size = 0;\n\n");
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "total_size += _extensions_.ByteSize();\n\n");
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  options = &this->options_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SetUnknkownFieldsVariable
            (this->descriptor_,options,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1d8);
  Formatter::AddMap((Formatter *)
                    &chunks.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1d8);
  if (this->num_required_fields_ < 2) {
    ppFVar14 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar14 != ppFVar4) {
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pFVar18 = *ppFVar14;
        if (*(int *)(pFVar18 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
          FieldName_abi_cxx11_((string *)local_180,(cpp *)pFVar18,field_00);
          Formatter::operator()
                    ((Formatter *)ppvVar2,"if (_internal_has_$1$()) {\n",(string *)local_180);
          if (local_180 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
            operator_delete((void *)local_180);
          }
          google::protobuf::io::Printer::Indent();
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar18);
          (*pFVar11->_vptr_FieldGenerator[0x14])(pFVar11,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
        }
        ppFVar14 = ppFVar14 + 1;
      } while (ppFVar14 != ppFVar4);
    }
  }
  else {
    RequiredFieldsBitMask
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&chunk_mask_str.field_2 + 8),this);
    has_bits_var.length_ = in_R9;
    has_bits_var.ptr_ = (char *)0xa;
    in_R8 = (int *)0xa;
    (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
              ((string *)local_180,(void *)((long)&chunk_mask_str.field_2 + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,true,has_bits_var);
    Formatter::operator()
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "if ($1$) {  // All required fields are present.\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    if (local_180 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
      operator_delete((void *)local_180);
    }
    google::protobuf::io::Printer::Indent();
    ppFVar14 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar14 != ppFVar4) {
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pFVar18 = *ppFVar14;
        if (*(int *)(pFVar18 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar18);
          (*pFVar11->_vptr_FieldGenerator[0x14])(pFVar11,printer);
          Formatter::operator()<>((Formatter *)ppvVar2,"\n");
        }
        ppFVar14 = ppFVar14 + 1;
      } while (ppFVar14 != ppFVar4);
    }
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if (chunk_mask_str.field_2._8_8_ != 0) {
      operator_delete((void *)chunk_mask_str.field_2._8_8_);
    }
  }
  auStack_a8 = (undefined1  [8])0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __position_00._M_current =
       chunks.
       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  for (ppFVar14 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __position_00._M_current, ppFVar14 != ppFVar4;
      ppFVar14 = ppFVar14 + 1) {
    pFVar18 = *ppFVar14;
    local_180 = (undefined1  [8])pFVar18;
    if ((auStack_a8 == (undefined1  [8])__position_00._M_current) ||
       (field = __position_00._M_current[-1].
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1],
       *(int *)(field + 0x3c) != *(int *)(pFVar18 + 0x3c))) {
LAB_001e3376:
      if (__position_00._M_current ==
          chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    *)auStack_a8,__position_00);
      }
      else {
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    else {
      iVar7 = HasBitIndex(this,field);
      iVar25 = iVar7 + 7;
      if (-1 < iVar7) {
        iVar25 = iVar7;
      }
      iVar25 = iVar25 >> 3;
      if (iVar7 == -1) {
        iVar25 = -1;
      }
      iVar8 = HasBitIndex(this,pFVar18);
      iVar7 = iVar8 + 7;
      if (-1 < iVar8) {
        iVar7 = iVar8;
      }
      iVar7 = iVar7 >> 3;
      if (iVar8 == -1) {
        iVar7 = -1;
      }
      if (iVar25 != iVar7) goto LAB_001e3376;
    }
    __position._M_current =
         chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(chunks.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1),__position,
                 (FieldDescriptor **)local_180);
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_180;
      pppFVar1 = &chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    __position_00._M_current =
         chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar15 = ((long)__position_00._M_current - (long)auStack_a8 >> 3) * -0x5555555555555555 >> 2;
  pvVar12 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)auStack_a8;
  if (0 < lVar15) {
    pvVar12 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)auStack_a8 + lVar15 * 4 * 0x18);
    lVar15 = lVar15 + 1;
    __first._M_current =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)((long)auStack_a8 + 0x30);
    do {
      if (*(int *)(*__first._M_current[-2].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001e34f7;
      }
      if (*(int *)(*__first._M_current[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001e34f7;
      }
      if (*(int *)(*((__first._M_current)->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) goto LAB_001e34f7;
      if (*(int *)(*__first._M_current[1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001e34f7;
      }
      lVar15 = lVar15 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar15);
  }
  lVar15 = ((long)__position_00._M_current - (long)pvVar12 >> 3) * -0x5555555555555555;
  if (lVar15 == 1) {
LAB_001e34d4:
    __first._M_current = pvVar12;
    if (*(int *)(*(pvVar12->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
      __first._M_current = __position_00._M_current;
    }
  }
  else if (lVar15 == 2) {
LAB_001e34c4:
    __first._M_current = pvVar12;
    if (*(int *)(*(pvVar12->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
      pvVar12 = pvVar12 + 1;
      goto LAB_001e34d4;
    }
  }
  else {
    __first._M_current = __position_00._M_current;
    if ((lVar15 == 3) &&
       (__first._M_current = pvVar12,
       *(int *)(*(pvVar12->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2)) {
      pvVar12 = pvVar12 + 1;
      goto LAB_001e34c4;
    }
  }
LAB_001e34f7:
  pvVar12 = __first._M_current + 1;
  if (pvVar12 != __position_00._M_current && __first._M_current != __position_00._M_current) {
    do {
      if (*(int *)(*(pvVar12->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::_M_move_assign(__first._M_current,pvVar12);
        __first._M_current = __first._M_current + 1;
      }
      pvVar12 = pvVar12 + 1;
    } while (pvVar12 != __position_00._M_current);
  }
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::_M_erase((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_a8,__first,
             (iterator)
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  has_bit_indices = &this->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_180,options,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_a8,has_bit_indices,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_34[0] = -1;
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
            );
  if ((undefined1  [8])
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
    uVar19 = 0;
    do {
      auVar5 = auStack_a8;
      psVar23 = &chunk_mask_str._M_string_length;
      ppFVar14 = (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)((long)auStack_a8 + uVar19 * 0x18))->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)((long)auStack_a8 + uVar19 * 0x18))->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar14) < 9) {
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      else {
        iVar25 = HasBitIndex(this,*ppFVar14);
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             CONCAT31((int3)(iVar25 + 0x1fU >> 8),iVar25 + 0x1fU < 0xffffffe0 && iVar25 != -1);
      }
      local_100 = (undefined1  [8])psVar23;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
      chunk_mask_str.field_2._8_8_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&masks_for_has_bits,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&cold_skipper.cold_threshold_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&masks_for_has_bits);
      if (local_100 != (undefined1  [8])psVar23) {
        operator_delete((void *)local_100);
      }
      pvVar12 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)auVar5 + uVar19 * 0x18);
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        uVar9 = anon_unknown_0::GenChunkMask(pvVar12,has_bit_indices);
        HVar26.value = (ulong)uVar9;
        HVar26._8_8_ = 8;
        google::protobuf::strings::AlphaNum::AlphaNum
                  ((AlphaNum *)((long)&chunk_mask_str.field_2 + 8),HVar26);
        local_100 = (undefined1  [8])psVar23;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,chunk_mask_str.field_2._8_8_,
                   (long)masks_for_has_bits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + chunk_mask_str.field_2._8_8_);
        if (uVar9 == 0) {
          bVar6 = true;
        }
        else {
          iVar25 = 0;
          uVar17 = uVar9;
          do {
            iVar25 = iVar25 + (uVar17 & 1);
            bVar6 = 1 < uVar17;
            uVar17 = uVar17 >> 1;
          } while (bVar6);
          bVar6 = iVar25 < 2;
        }
        if (bVar6) {
          google::protobuf::internal::LogMessage::LogMessage
                    (local_248,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xf10);
          pLVar13 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              (local_248,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage(local_248);
        }
        uVar21 = 0;
        if (uVar9 != 0) {
          do {
            uVar21 = uVar21 + (uVar9 & 1);
            bVar6 = 1 < uVar9;
            uVar9 = uVar9 >> 1;
          } while (bVar6);
          uVar21 = (uint)(8 < (int)uVar21);
        }
        if ((char)uVar21 != '\0') {
          google::protobuf::internal::LogMessage::LogMessage
                    (local_210,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xf11);
          pLVar13 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              (local_210,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)(chunk_mask_str.field_2._M_local_buf + 8),pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage(local_210);
        }
        iVar7 = local_34[0];
        iVar8 = HasBitIndex(this,*(pvVar12->
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        iVar25 = iVar8 + 0x1f;
        if (-1 < iVar8) {
          iVar25 = iVar8;
        }
        iVar25 = iVar25 >> 5;
        if (iVar8 == -1) {
          iVar25 = -1;
        }
        if (iVar7 != iVar25) {
          local_34[0] = iVar25;
          Formatter::operator()
                    ((Formatter *)
                     &chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "cached_has_bits = _has_bits_[$1$];\n",local_34);
        }
        Formatter::operator()
                  ((Formatter *)
                   &chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        google::protobuf::io::Printer::Indent();
        if (local_100 != (undefined1  [8])psVar23) {
          operator_delete((void *)local_100);
        }
      }
      ppFVar14 = (pvVar12->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar12->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
        uVar24 = 0;
        do {
          pFVar18 = ppFVar14[uVar24];
          pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar18);
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)
                     &chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar18);
          iVar25 = *(int *)(pFVar18 + 0x3c);
          if (iVar25 == 3) {
            bVar6 = false;
          }
          else {
            psVar3 = (string *)((long)&chunk_mask_str.field_2 + 8);
            if (pFVar18[0x41] == (FieldDescriptor)0x0) {
              if ((iVar25 == 1) && (*(int *)(*(long *)(pFVar18 + 0x28) + 0x3c) == 2)) {
                if (*(long *)(pFVar18 + 0x58) == 0) goto LAB_001e3865;
              }
              else if (iVar25 == 2) goto LAB_001e3865;
            }
            else {
LAB_001e3865:
              if (*(char *)(*(long *)(pFVar18 + 0x78) + 0x4f) == '\0') {
                bVar6 = true;
                anon_unknown_0::PrintPresenceCheck
                          ((Formatter *)
                           &chunks.
                            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar18,
                           has_bit_indices,(Printer *)local_34,in_R8);
                goto LAB_001e38f9;
              }
            }
            chunk_mask_str.field_2._8_8_ =
                 &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"this->","");
            bVar6 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,psVar3,pFVar18);
            if ((pointer *)chunk_mask_str.field_2._8_8_ !=
                &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)chunk_mask_str.field_2._8_8_);
            }
          }
LAB_001e38f9:
          (*pFVar11->_vptr_FieldGenerator[0x14])(pFVar11,printer);
          if (bVar6 != false) {
            google::protobuf::io::Printer::Outdent();
            Formatter::operator()<>
                      ((Formatter *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n\n");
          }
          if (iVar25 == 3) {
            Formatter::operator()<>
                      ((Formatter *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
          }
          uVar24 = uVar24 + 1;
          ppFVar14 = (pvVar12->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar24 < (ulong)((long)(pvVar12->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar14
                                 >> 3));
      }
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>
                  ((Formatter *)
                   &chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
      }
      bVar6 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)local_180,(int)uVar19,printer);
      if (bVar6) {
        local_34[0] = -1;
      }
      uVar19 = uVar19 + 1;
      uVar24 = ((long)chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
               -0x5555555555555555;
    } while (uVar19 <= uVar24 && uVar24 - uVar19 != 0);
  }
  __end3._0_8_ = this->descriptor_;
  local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffff00000000);
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = *(undefined4 *)(__end3._0_8_ + 0x70)
  ;
  ppvVar2 = &chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar3 = (string *)(&chunk_mask_str.field_2._M_allocated_capacity + 1);
  chunk_mask_str._M_dataplus._M_p = (pointer)__end3._0_8_;
  while (bVar6 = operator==((Iterator *)local_100,
                            (Iterator *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
        !bVar6) {
    lVar16 = (long)(int)local_100._0_4_;
    lVar15 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
    Formatter::operator()
              ((Formatter *)ppvVar2,"switch ($1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar15 + lVar16 * 0x30));
    google::protobuf::io::Printer::Indent();
    plVar22 = (long *)(lVar15 + lVar16 * 0x30);
    cold_skipper.limit_chunk_ = 0;
    __end3.descriptor._0_4_ = (undefined4)plVar22[3];
    while (bVar6 = operator==((Iterator *)&cold_skipper.limit_chunk_,(Iterator *)&__end3.descriptor)
          , !bVar6) {
      pFVar18 = *(FieldDescriptor **)(plVar22[4] + (long)cold_skipper.limit_chunk_ * 8);
      PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
      UnderscoresToCamelCase(psVar3,*(string **)pFVar18,true);
      Formatter::operator()((Formatter *)ppvVar2,"case k$1$: {\n",psVar3);
      if ((pointer *)chunk_mask_str.field_2._8_8_ !=
          &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)chunk_mask_str.field_2._8_8_);
      }
      google::protobuf::io::Printer::Indent();
      pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar18);
      (*pFVar11->_vptr_FieldGenerator[0x14])(pFVar11,printer);
      Formatter::operator()<>((Formatter *)ppvVar2,"break;\n");
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
      cold_skipper.limit_chunk_ = cold_skipper.limit_chunk_ + 1;
    }
    chunk_mask_str.field_2._8_8_ =
         &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish;
    lVar15 = *(long *)*plVar22;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar3,lVar15,((long *)*plVar22)[1] + lVar15);
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      puVar20 = (pointer)0x0;
      do {
        if ((byte)(*(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) + 0x9fU) < 0x1a) {
          *(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) =
               *(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) + -0x20;
        }
        puVar20 = (pointer)((long)puVar20 + 1);
      } while (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start != puVar20);
    }
    Formatter::operator()((Formatter *)ppvVar2,"case $1$_NOT_SET: {\n  break;\n}\n",psVar3);
    if ((pointer *)chunk_mask_str.field_2._8_8_ !=
        &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)chunk_mask_str.field_2._8_8_);
    }
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
    local_100._0_4_ = local_100._0_4_ + 1;
  }
  if (this->num_weak_fields_ != 0) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
  FVar10 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),options,(bool *)0x0);
  format_00 = 
  "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n      _internal_metadata_, total_size, &_cached_size_);\n"
  ;
  if (FVar10 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    format_00 = "  total_size += $unknown_fields$.size();\n";
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,format_00);
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
            );
  google::protobuf::io::Printer::Outdent();
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&cold_skipper.cold_threshold_);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)auStack_a8);
  this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1d8;
LAB_001e3ce1:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_01);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknkownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n"
        "      _internal_metadata_, total_size, &_cached_size_);\n");
  } else {
    format("  total_size += $unknown_fields$.size();\n");
  }
  format("}\n");

  // We update _cached_size_ even though this is a const method.  Because
  // const methods might be called concurrently this needs to be atomic
  // operations or the program is undefined.  In practice, since any concurrent
  // writes will be writing the exact same value, normal writes will work on
  // all common processors. We use a dedicated wrapper class to abstract away
  // the underlying atomic. This makes it easier on platforms where even relaxed
  // memory order might have perf impact to replace it with ordinary loads and
  // stores.
  format(
      "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
      "SetCachedSize(cached_size);\n"
      "return total_size;\n");

  format.Outdent();
  format("}\n");
}